

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O2

void event_debug_note_teardown_(event *ev)

{
  event_debug_entry **ppeVar1;
  event_debug_entry *peVar2;
  event_debug_entry find;
  undefined1 auStack_18 [24];
  
  if (event_debug_mode_on_ != 0) {
    peVar2 = (event_debug_entry *)event_debug_map_lock_;
    auStack_18._8_8_ = ev;
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
    }
    ppeVar1 = event_debug_map_HT_FIND_P_((event_debug_map *)auStack_18,peVar2);
    if ((ppeVar1 != (event_debug_entry **)0x0) &&
       (peVar2 = *ppeVar1, peVar2 != (event_debug_entry *)0x0)) {
      *ppeVar1 = (peVar2->node).hte_next;
      (peVar2->node).hte_next = (event_debug_entry *)0x0;
      global_debug_map.hth_n_entries = global_debug_map.hth_n_entries - 1;
      event_mm_free_(peVar2);
    }
    if (event_debug_map_lock_ != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
    }
  }
  event_debug_mode_too_late = 1;
  return;
}

Assistant:

static void event_debug_note_teardown_(const struct event *ev)
{
	struct event_debug_entry *dent, find;

	if (!event_debug_mode_on_)
		goto out;

	find.ptr = ev;
	EVLOCK_LOCK(event_debug_map_lock_, 0);
	dent = HT_REMOVE(event_debug_map, &global_debug_map, &find);
	if (dent)
		mm_free(dent);
	EVLOCK_UNLOCK(event_debug_map_lock_, 0);

out:
	event_debug_mode_too_late = 1;
}